

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

int32_t __thiscall
DeviceTy::data_submit(DeviceTy *this,void *TgtPtrBegin,void *HstPtrBegin,int64_t Size)

{
  int32_t iVar1;
  OmptInterface *pOVar2;
  
  pOVar2 = (OmptInterface *)_ZTW14ompt_interface();
  OmptInterface::target_data_submit_begin(pOVar2,(long)this->DeviceID,TgtPtrBegin,HstPtrBegin,Size);
  iVar1 = (*(code *)this->RTL->data_submit)(this->RTLDeviceID,TgtPtrBegin,HstPtrBegin,Size);
  pOVar2 = (OmptInterface *)_ZTW14ompt_interface();
  OmptInterface::target_data_submit_end(pOVar2,(long)this->DeviceID,TgtPtrBegin,HstPtrBegin,Size);
  return iVar1;
}

Assistant:

int32_t DeviceTy::data_submit(void *TgtPtrBegin, void *HstPtrBegin,
    int64_t Size) {
  DP("enter DeviceTy::data_submit\n");
  ompt_interface.target_data_submit_begin(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  int32_t result = RTL->data_submit(RTLDeviceID, TgtPtrBegin, HstPtrBegin, Size); 
  ompt_interface.target_data_submit_end(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  DP("exit DeviceTy::data_submit\n");
  return result;
}